

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CustomLayerParams::MergePartialFromCodedStream
          (CustomLayerParams *this,CodedInputStream *input)

{
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
  *pMVar1;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  uint8 *puVar5;
  bool bVar6;
  short extraout_AX;
  uint uVar7;
  uint extraout_EAX;
  uint32 uVar8;
  Type *this_00;
  pair<int,_int> pVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  parser;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  local_88;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_40 = &this->description_;
  pMVar1 = &(this->parameters_).map_;
  local_38 = &(this->weights_).super_RepeatedPtrFieldBase;
  local_48 = &this->classname_;
  do {
    pbVar4 = input->buffer_;
    uVar8 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar3 = *pbVar4;
      uVar8 = (uint32)bVar3;
      pbVar2 = pbVar4 + 1;
      uVar10 = (uint)bVar3;
      if ((char)bVar3 < '\x01') {
        if ((input->buffer_end_ <= pbVar2) || ((~(uint)*pbVar2 & uVar10) < 0x80)) goto LAB_00227630;
        uVar10 = ((uint)bVar3 + (uint)*pbVar2 * 0x80) - 0x80;
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar2;
      }
      uVar11 = (ulong)uVar10 | 0x100000000;
    }
    else {
LAB_00227630:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar10 = (uint)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_002273ae;
    uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
    if (uVar7 < 0x1e) {
      if (uVar7 == 0x14) {
        if ((char)uVar11 != -0x5e) goto LAB_002273ae;
        this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::TypeHandler>
                            (local_38,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar12 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
          input->buffer_ = puVar5 + 1;
          bVar6 = true;
        }
        else {
          iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < iVar12;
        }
        iVar13 = 6;
        if ((((bVar6) &&
             (pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                                (input,iVar12), -1 < (long)pVar9)) &&
            (bVar6 = WeightParams::MergePartialFromCodedStream(this_00,input), bVar6)) &&
           (bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar9.first), bVar6)) goto LAB_002273da;
      }
      else {
        if ((uVar7 != 10) || (MergePartialFromCodedStream(), extraout_AX == 0)) goto LAB_002273ae;
        if (extraout_AX == 1) goto LAB_002273da;
LAB_002274fd:
        iVar13 = (int)local_88.mf_;
      }
    }
    else if (uVar7 == 0x1e) {
      if ((char)uVar11 != -0xe) goto LAB_002273ae;
      local_88.key_._M_dataplus._M_p = (pointer)&local_88.key_.field_2;
      local_88.key_._M_string_length = 0;
      local_88.key_.field_2._M_local_buf[0] = '\0';
      local_88.entry_.ptr_ =
           (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
            *)0x0;
      puVar5 = input->buffer_;
      local_88.mf_ = &this->parameters_;
      local_88.map_ = pMVar1;
      if ((puVar5 < input->buffer_end_) && (iVar12 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
        input->buffer_ = puVar5 + 1;
        bVar6 = true;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar6 = -1 < iVar12;
      }
      iVar13 = 6;
      if ((((bVar6) &&
           (pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                              (input,iVar12), -1 < (long)pVar9)) &&
          (bVar6 = google::protobuf::internal::
                   MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                   ::
                   Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
                   ::MergePartialFromCodedStream(&local_88,input), bVar6)) &&
         (bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar9.first), bVar6)) {
        bVar6 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (local_88.key_._M_dataplus._M_p,(int)local_88.key_._M_string_length,PARSE,
                           "CoreML.Specification.CustomLayerParams.ParametersEntry.key");
        iVar13 = 6;
        if (bVar6) {
          iVar13 = 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (local_88.entry_.ptr_ !=
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *)0x0) {
        (*((local_88.entry_.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.key_._M_dataplus._M_p != &local_88.key_.field_2) {
        operator_delete(local_88.key_._M_dataplus._M_p,
                        CONCAT71(local_88.key_.field_2._M_allocated_capacity._1_7_,
                                 local_88.key_.field_2._M_local_buf[0]) + 1);
      }
      if (bVar6 == false) goto LAB_002273dd;
LAB_002273da:
      iVar13 = 0;
    }
    else {
      if (uVar7 == 0x28) {
        MergePartialFromCodedStream();
        if ((short)extraout_EAX == 1) goto LAB_002273da;
        if ((extraout_EAX & 0xffff) != 0) goto LAB_002274fd;
      }
LAB_002273ae:
      iVar13 = 7;
      if ((uVar10 & 7) != 4 && uVar10 != 0) {
        bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar10);
        if (bVar6) goto LAB_002273da;
        iVar13 = 6;
      }
    }
LAB_002273dd:
    if (iVar13 != 0) {
      return iVar13 != 6;
    }
  } while( true );
}

Assistant:

bool CustomLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CustomLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string className = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_classname()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->classname().data(), this->classname().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.className"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.WeightParams weights = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          CustomLayerParams_ParametersEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              CustomLayerParams_ParametersEntry,
              ::std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              ::google::protobuf::internal::WireFormatLite::TYPE_MESSAGE,
              0 >,
            ::google::protobuf::Map< ::std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue > > parser(&parameters_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.key().data(), parser.key().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.ParametersEntry.key"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string description = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_description()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->description().data(), this->description().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.description"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CustomLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CustomLayerParams)
  return false;
#undef DO_
}